

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.h
# Opt level: O0

bool __thiscall
google::protobuf::MessageLite::
ParseFrom<(google::protobuf::MessageLite::ParseFlags)1,std::basic_string_view<char,std::char_traits<char>>>
          (MessageLite *this,basic_string_view<char,_std::char_traits<char>_> *input)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  LogMessage *pLVar3;
  ClassDataFull *pCVar4;
  ParseFlags in_R9D;
  string_view input_00;
  TcParseTableBase *tc_table;
  bool alias;
  basic_string_view<char,_std::char_traits<char>_> *input_local;
  MessageLite *this_local;
  LogMessage local_70;
  Voidify local_59;
  TcParseTableBase *local_58;
  TcParseTableBase *tc_table_1;
  byte local_39;
  LogMessage local_38;
  Voidify local_21;
  ClassData *local_20;
  ClassData *data;
  TcParseTableBase *local_10;
  
  (*this->_vptr_MessageLite[2])();
  data = (ClassData *)this;
  iVar2 = (*this->_vptr_MessageLite[4])();
  local_20 = (ClassData *)CONCAT44(extraout_var,iVar2);
  local_39 = 0;
  if (local_20 == (ClassData *)0x0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_38,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/message_lite.h"
               ,0x3a2,"data != nullptr");
    local_39 = 1;
    pLVar3 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_38);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_21,pLVar3);
  }
  if ((local_39 & 1) != 0) {
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_38);
  }
  local_58 = local_20->tc_table;
  local_10 = local_58;
  if (local_58 == (TcParseTableBase *)0x0) {
    if ((local_20->is_lite & 1U) != 0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_70,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/message_lite.h"
                 ,0x3a6,"!data->is_lite");
      pLVar3 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_70);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_59,pLVar3);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_70);
    }
    pCVar4 = internal::ClassData::full(local_20);
    local_10 = (*pCVar4->descriptor_methods->get_tc_table)(this);
  }
  input_00._M_str = (char *)this;
  input_00._M_len = (size_t)input->_M_str;
  bVar1 = internal::MergeFromImpl<false>
                    ((internal *)input->_M_len,input_00,(MessageLite *)local_10,
                     (TcParseTableBase *)0x1,in_R9D);
  return bVar1;
}

Assistant:

bool MessageLite::ParseFrom(const T& input) {
  if (flags & kParse) Clear();
  constexpr bool alias = (flags & kMergeWithAliasing) != 0;
  const internal::TcParseTableBase* tc_table;
  PROTOBUF_ALWAYS_INLINE_CALL tc_table = GetTcParseTable();
  return internal::MergeFromImpl<alias>(input, this, tc_table, flags);
}